

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O3

int is_sparse_supported(char *path)

{
  int iVar1;
  uint uVar2;
  __off_t _Var3;
  sparse sparse_file [3];
  sparse sparse_file_1 [3];
  sparse local_488;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  sparse local_458;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined4 local_418 [2];
  undefined4 local_410;
  
  local_478 = 0;
  uStack_460 = 0;
  local_488.type = HOLE;
  local_488._4_4_ = 0;
  local_488.size = 0x400;
  uStack_470 = 0x2800;
  local_468 = 2;
  create_sparse_file("can_sparse",&local_488);
  iVar1 = open("can_sparse",2);
  uVar2 = 0;
  if (-1 < iVar1) {
    _Var3 = lseek(iVar1,0,4);
    close(iVar1);
    unlink("can_sparse");
    uVar2 = 1;
    if ((int)_Var3 < 0) {
      local_448 = 0;
      uStack_430 = 0;
      local_458.type = HOLE;
      local_458._4_4_ = 0;
      local_458.size = 0x400;
      uStack_440 = 0x2800;
      local_438 = 2;
      memset(local_418,0,0x3f0);
      create_sparse_file("can_sparse",&local_458);
      iVar1 = open("can_sparse",2);
      uVar2 = 0;
      if (-1 < iVar1) {
        local_428 = 0;
        local_420 = 0xffffffffffffffff;
        local_418[0] = 1;
        local_410 = 0x11;
        uVar2 = ioctl(iVar1,0xc020660b);
        close(iVar1);
        unlink("can_sparse");
        uVar2 = ~uVar2 >> 0x1f;
      }
    }
  }
  return uVar2;
}

Assistant:

static int
is_sparse_supported(const char *path)
{
	const struct sparse sparse_file[] = {
 		/* This hole size is too small to create a sparse
		 * files for almost filesystem. */
		{ HOLE,	 1024 }, { DATA, 10240 },
		{ END,	0 }
	};
	int fd, r;
	const char *testfile = "can_sparse";

	(void)path; /* UNUSED */
	create_sparse_file(testfile, sparse_file);
	fd = open(testfile,  O_RDWR);
	if (fd < 0)
		return (0);
	r = lseek(fd, 0, SEEK_HOLE);
	close(fd);
	unlink(testfile);
#if defined(HAVE_LINUX_FIEMAP_H)
	if (r < 0)
		return (is_sparse_supported_fiemap(path));
	return (1);
#else
	return (r >= 0);
#endif
}